

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O0

void wait_for_mapnotify(Display *dpy,Window *xlib_window)

{
  int local_d8 [2];
  XEvent event_return;
  Window *xlib_window_local;
  Display *dpy_local;
  
  event_return.pad[0x17] = (long)xlib_window;
  xlib_window_local = (Window *)dpy;
  do {
    XPeekIfEvent(xlib_window_local,local_d8,is_mapnotify,event_return.pad[0x17]);
  } while (local_d8[0] != 0x13);
  return;
}

Assistant:

void
wait_for_mapnotify(Display *dpy, Window *xlib_window)
{
  XEvent event_return;

  while (true) {
    XPeekIfEvent(dpy, &event_return, is_mapnotify, (XPointer)xlib_window);
    // XPeekIfEvent may have returned without setting event_return (in other
    // words, is_mapnotify returned False).
    if (event_return.type == MapNotify)
      return;
  }
}